

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_>::freeData
          (Span<QHashPrivate::Node<QGesture_*,_QPointer<QWidget>_>_> *this)

{
  Entry *pEVar1;
  int *piVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  
  if (this->entries != (Entry *)0x0) {
    lVar5 = 0;
    do {
      uVar3 = (ulong)this->offsets[lVar5];
      if (uVar3 != 0xff) {
        pEVar1 = this->entries;
        piVar2 = *(int **)(pEVar1[uVar3].storage.data + 8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar4 = *(void **)(pEVar1[uVar3].storage.data + 8);
            if (pvVar4 == (void *)0x0) {
              pvVar4 = (void *)0x0;
            }
            operator_delete(pvVar4);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }